

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatting.cpp
# Opt level: O3

string * __thiscall
Test::Formats::internal::utf8_to_string_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,uint8_t *ptr,size_t length)

{
  pointer pcVar1;
  undefined8 uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (NATIVE_UTF8) {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,this,ptr + (long)this);
    pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_38,0,0,"\'",1);
    local_58._M_dataplus._M_p = (pbVar3->_M_dataplus)._M_p;
    paVar4 = &pbVar3->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p == paVar4) {
      local_58.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
      local_58.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    }
    else {
      local_58.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
    }
    local_58._M_string_length = pbVar3->_M_string_length;
    (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
    pbVar3->_M_string_length = 0;
    (pbVar3->field_2)._M_local_buf[0] = '\0';
    pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_58,"\'");
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (pbVar3->_M_dataplus)._M_p;
    paVar4 = &pbVar3->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar1 == paVar4) {
      uVar2 = *(undefined8 *)((long)&pbVar3->field_2 + 8);
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar4->_M_allocated_capacity;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar2;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = pcVar1;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar4->_M_allocated_capacity;
    }
    __return_storage_ptr__->_M_string_length = pbVar3->_M_string_length;
    (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
    pbVar3->_M_string_length = 0;
    (pbVar3->field_2)._M_local_buf[0] = '\0';
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,"(unknown encoding)","");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Formats::internal::utf8_to_string(const uint8_t *ptr, std::size_t length) {
  if (NATIVE_UTF8) {
    return "'" + std::string(reinterpret_cast<const char *>(ptr), length) + "'";
  }
#ifdef _MSC_VER
  std::wstring tmp(length * 2U, L'\0');
  auto numChars =
      MultiByteToWideChar(CP_UTF8, 0, reinterpret_cast<const char *>(ptr), length, &tmp.front(), tmp.size());
  tmp.resize(numChars);
  std::string result(length * 2U, '\0');
  numChars = WideCharToMultiByte(CP_ACP, 0, tmp.data(), tmp.size(), &result.front(), result.size(), nullptr, nullptr);
  result.resize(numChars);
  return "'" + result + "'";
#else
  return "(unknown encoding)";
#endif
}